

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void leaveblock(FuncState *fs)

{
  undefined8 *puVar1;
  int *piVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  LexState *ls;
  BlockCnt *pBVar6;
  Vardesc *pVVar7;
  LocVar *pLVar8;
  Labeldesc *pLVar9;
  Dyndata *pDVar10;
  FuncState *fs_00;
  Instruction *pIVar11;
  undefined8 uVar12;
  byte bVar13;
  uint uVar14;
  Instruction IVar15;
  int iVar16;
  TString *name;
  lu_byte *plVar17;
  ulong uVar18;
  uint uVar19;
  byte bVar20;
  Dyndata *dyd;
  long lVar21;
  LexState *ls_00;
  long lVar22;
  int iVar23;
  Dyndata *pDVar24;
  
  ls = fs->ls;
  pBVar6 = fs->bl;
  bVar13 = pBVar6->nactvar;
  uVar14 = (uint)bVar13;
  uVar19 = uVar14;
  do {
    if ((int)uVar19 < 1) {
      bVar20 = 0;
      goto LAB_0011683c;
    }
    uVar19 = uVar19 - 1;
    pVVar7 = (ls->dyd->actvar).arr;
    lVar21 = (long)(int)(fs->firstlocal + uVar19);
  } while (*(char *)((long)pVVar7 + lVar21 * 0x18 + 9) == '\x03');
  bVar20 = (&pVVar7->vd)[lVar21].ridx + 1;
LAB_0011683c:
  ls_00 = ls;
  if ((pBVar6->previous != (BlockCnt *)0x0) && (pBVar6->upval != '\0')) {
    luaK_codeABCk(fs,OP_CLOSE,(uint)bVar20,0,0,0);
    bVar13 = pBVar6->nactvar;
    uVar14 = (uint)bVar13;
    ls_00 = fs->ls;
  }
  fs->freereg = bVar20;
  bVar20 = fs->nactvar;
  pDVar24 = ls_00->dyd;
  piVar2 = &(pDVar24->actvar).n;
  *piVar2 = *piVar2 + (uVar14 - bVar20);
  if (bVar13 < bVar20) {
    pVVar7 = (pDVar24->actvar).arr;
    iVar23 = (bVar20 - 1 & 0xff) + fs->firstlocal;
    do {
      bVar20 = bVar20 - 1;
      fs->nactvar = bVar20;
      if ((*(char *)((long)pVVar7 + (long)iVar23 * 0x18 + 9) != '\x03') &&
         (pLVar8 = fs->f->locvars, pLVar8 != (LocVar *)0x0)) {
        pLVar8[(&pVVar7->vd)[iVar23].pidx].endpc = fs->pc;
      }
      iVar23 = iVar23 + -1;
    } while (bVar13 < bVar20);
  }
  if (pBVar6->isloop == '\x02') {
    name = luaS_newlstr(ls->L,"break",5);
    pDVar24 = ls->dyd;
    iVar23 = luaK_getlabel(ls->fs);
    newlabelentry(ls,&pDVar24->label,name,0,iVar23);
    ls_00 = fs->ls;
    pDVar24 = ls_00->dyd;
    uVar14 = (uint)pBVar6->nactvar;
  }
  do {
    if ((int)uVar14 < 1) {
      bVar13 = 0;
      goto LAB_00116967;
    }
    uVar14 = uVar14 - 1;
    pVVar7 = (pDVar24->actvar).arr;
    lVar21 = (long)(int)(fs->firstlocal + uVar14);
  } while (*(char *)((long)pVVar7 + lVar21 * 0x18 + 9) == '\x03');
  bVar13 = (&pVVar7->vd)[lVar21].ridx + 1;
LAB_00116967:
  iVar23 = pBVar6->firstgoto;
  iVar16 = (pDVar24->gt).n;
  if (iVar23 < iVar16) {
LAB_0011697d:
    pLVar9 = (pDVar24->gt).arr;
    lVar21 = (long)iVar23;
    iVar4 = pBVar6->firstlabel;
    pDVar10 = ls_00->dyd;
    iVar5 = (pDVar10->label).n;
    if (iVar4 < iVar5) {
      lVar22 = (long)iVar5 - (long)iVar4;
      plVar17 = &(pDVar10->label).arr[iVar4].nactvar;
      do {
        if (((Labeldesc *)(plVar17 + -0x10))->name == pLVar9[lVar21].name) {
          pLVar9 = (pDVar10->gt).arr + lVar21;
          bVar20 = *plVar17;
          uVar14 = (uint)bVar20;
          if (pLVar9->nactvar < bVar20) {
            jumpscopeerror(ls_00,pLVar9);
          }
          fs_00 = ls_00->fs;
          if ((pLVar9->close != '\0') || ((pBVar6->upval != '\0' && (bVar20 < pLVar9->nactvar))))
          goto LAB_00116a4a;
          iVar16 = pLVar9->pc;
          goto LAB_00116aae;
        }
        plVar17 = plVar17 + 0x18;
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
    if (pBVar6->upval != '\0') {
      uVar14 = (uint)pLVar9[lVar21].nactvar;
      do {
        if ((int)uVar14 < 1) goto LAB_00116a09;
        uVar14 = uVar14 - 1;
        pVVar7 = (fs->ls->dyd->actvar).arr;
        lVar22 = (long)(int)(fs->firstlocal + uVar14);
      } while (*(char *)((long)pVVar7 + lVar22 * 0x18 + 9) == '\x03');
      if (bVar13 < (byte)((&pVVar7->vd)[lVar22].ridx + 1)) {
        pLVar9[lVar21].close = '\x01';
      }
    }
LAB_00116a09:
    pLVar9[lVar21].nactvar = pBVar6->nactvar;
    iVar23 = iVar23 + 1;
    goto LAB_00116b04;
  }
LAB_00116b17:
  (pDVar24->label).n = pBVar6->firstlabel;
  if (pBVar6->previous == (BlockCnt *)0x0) {
    if (pBVar6->firstgoto < (ls->dyd->gt).n) {
      undefgoto(ls,(ls->dyd->gt).arr + pBVar6->firstgoto);
    }
  }
  fs->bl = pBVar6->previous;
  return;
  while( true ) {
    uVar14 = uVar14 - 1;
    pVVar7 = (fs_00->ls->dyd->actvar).arr;
    lVar22 = (long)(int)(fs_00->firstlocal + uVar14);
    if (*(char *)((long)pVVar7 + lVar22 * 0x18 + 9) != '\x03') break;
LAB_00116a4a:
    if ((int)uVar14 < 1) {
      IVar15 = 0x36;
      goto LAB_00116a8a;
    }
  }
  IVar15 = (uint)(byte)((&pVVar7->vd)[lVar22].ridx + 1) << 7 | 0x36;
LAB_00116a8a:
  pIVar11 = fs_00->f->code;
  pIVar11[(long)pLVar9->pc + 1] = pIVar11[pLVar9->pc];
  pIVar11[pLVar9->pc] = IVar15;
  iVar16 = pLVar9->pc + 1;
  pLVar9->pc = iVar16;
LAB_00116aae:
  luaK_patchlist(fs_00,iVar16,*(int *)(plVar17 + -8));
  uVar14 = (pDVar10->gt).n - 1;
  uVar18 = (ulong)uVar14;
  if (iVar23 < (int)uVar14) {
    lVar22 = lVar21 * 0x18;
    do {
      pLVar9 = (pDVar10->gt).arr;
      lVar21 = lVar21 + 1;
      *(undefined8 *)(&pLVar9->nactvar + lVar22) = *(undefined8 *)(&pLVar9[1].nactvar + lVar22);
      puVar3 = (undefined8 *)((long)&pLVar9[1].name + lVar22);
      uVar12 = puVar3[1];
      puVar1 = (undefined8 *)((long)&pLVar9->name + lVar22);
      *puVar1 = *puVar3;
      puVar1[1] = uVar12;
      uVar18 = (long)(pDVar10->gt).n - 1;
      lVar22 = lVar22 + 0x18;
    } while (lVar21 < (long)uVar18);
  }
  (pDVar10->gt).n = (int)uVar18;
  iVar16 = (pDVar24->gt).n;
LAB_00116b04:
  if (iVar16 <= iVar23) goto LAB_00116b13;
  goto LAB_0011697d;
LAB_00116b13:
  pDVar24 = ls_00->dyd;
  goto LAB_00116b17;
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  LexState *ls = fs->ls;
  lu_byte stklevel = reglevel(fs, bl->nactvar);  /* level outside block */
  if (bl->previous && bl->upval)  /* need a 'close'? */
    luaK_codeABC(fs, OP_CLOSE, stklevel, 0, 0);
  fs->freereg = stklevel;  /* free registers */
  removevars(fs, bl->nactvar);  /* remove block locals */
  lua_assert(bl->nactvar == fs->nactvar);  /* back to level on entry */
  if (bl->isloop == 2)  /* has to fix pending breaks? */
    createlabel(ls, luaS_newliteral(ls->L, "break"), 0, 0);
  solvegotos(fs, bl);
  if (bl->previous == NULL) {  /* was it the last block? */
    if (bl->firstgoto < ls->dyd->gt.n)  /* still pending gotos? */
      undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
  }
  fs->bl = bl->previous;  /* current block now is previous one */
}